

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

void __thiscall
Js::ProbeContainer::DispatchAsyncBreak(ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  bool bVar1;
  FunctionBody *this_00;
  
  Output::Trace(DebuggerPhase,L"ProbeContainer::DispatchAsyncBreak: start: this=%p, pHaltState=%p\n"
                ,this,pHaltState);
  if (this->pAsyncHaltCallback != (HaltCallback *)0x0) {
    bVar1 = CanDispatchHalt(this,pHaltState);
    if (bVar1) {
      InitializeLocation(this,pHaltState,false);
      bVar1 = InterpreterHaltState::IsValid(pHaltState);
      Output::Trace(DebuggerPhase,
                    L"ProbeContainer::DispatchAsyncBreak: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"
                    ,pHaltState,(ulong)bVar1);
      bVar1 = InterpreterHaltState::IsValid(pHaltState);
      if (bVar1) {
        AsyncBreakController::Activate
                  (&this->debugManager->asyncBreakController,this->pAsyncHaltCallback);
        bVar1 = AsyncBreakController::IsAtStoppingLocation
                          (&this->debugManager->asyncBreakController,pHaltState);
        if (bVar1) {
          Output::Trace(DebuggerPhase,
                        L"ProbeContainer::DispatchAsyncBreak: IsAtStoppingLocation: pHaltState=%p\n"
                        ,pHaltState);
          this_00 = InterpreterHaltState::GetFunction(pHaltState);
          FunctionBody::CheckAndRegisterFuncToDiag(this_00,this->pScriptContext);
          StepController::Deactivate(&this->debugManager->stepController,pHaltState);
          AsyncBreakController::DispatchAndReset
                    (&this->debugManager->asyncBreakController,pHaltState);
        }
      }
      DestroyLocation(this);
      Output::Trace(DebuggerPhase,L"ProbeContainer::DispatchAsyncBreak: end: pHaltState=%p\n",
                    pHaltState);
      return;
    }
  }
  return;
}

Assistant:

void ProbeContainer::DispatchAsyncBreak(InterpreterHaltState* pHaltState)
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchAsyncBreak: start: this=%p, pHaltState=%p\n"), this, pHaltState);

        if (!this->pAsyncHaltCallback || !CanDispatchHalt(pHaltState))
        {
            return;
        }

        TryFinally([&]()
        {
            InitializeLocation(pHaltState, /* We don't need to match script context, stop at any available script function */ false);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchAsyncBreak: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            if (pHaltState->IsValid())
            {
                // Activate the current haltCallback with asyncStepController.
                debugManager->asyncBreakController.Activate(this->pAsyncHaltCallback);
                if (debugManager->asyncBreakController.IsAtStoppingLocation(pHaltState))
                {
                    OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchAsyncBreak: IsAtStoppingLocation: pHaltState=%p\n"), pHaltState);

                    pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                    debugManager->stepController.Deactivate(pHaltState);
                    debugManager->asyncBreakController.DispatchAndReset(pHaltState);
                }
            }
        },
        [&](bool)
        {
            DestroyLocation();
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchAsyncBreak: end: pHaltState=%p\n"), pHaltState);
    }